

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWritePla.c
# Opt level: O0

int Io_WriteMoPla(Abc_Ntk_t *pNtk,char *pFileName)

{
  char *pcVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  FILE *pFile;
  char *pFileName_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar2 = Abc_NtkIsStrash(pNtk);
  if (iVar2 != 0) {
    iVar2 = Abc_NtkCiNum(pNtk);
    if (iVar2 < 0x11) {
      __stream = fopen(pFileName,"w");
      if (__stream == (FILE *)0x0) {
        fprintf(_stdout,"Io_WritePla(): Cannot open the output file.\n");
        pNtk_local._4_4_ = 0;
      }
      else {
        pcVar1 = pNtk->pName;
        pcVar3 = Extra_TimeStamp();
        fprintf(__stream,"# Benchmark \"%s\" written by ABC on %s\n",pcVar1,pcVar3);
        Io_WriteMoPlaOne((FILE *)__stream,pNtk);
        fclose(__stream);
        pNtk_local._4_4_ = 1;
      }
    }
    else {
      printf("Cannot write multi-output PLA for more than 16 inputs.\n");
      pNtk_local._4_4_ = 0;
    }
    return pNtk_local._4_4_;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWritePla.c"
                ,0x1ae,"int Io_WriteMoPla(Abc_Ntk_t *, char *)");
}

Assistant:

int Io_WriteMoPla( Abc_Ntk_t * pNtk, char * pFileName )
{
    FILE * pFile;
    assert( Abc_NtkIsStrash(pNtk) );
    if ( Abc_NtkCiNum(pNtk) > 16 )
    {
        printf( "Cannot write multi-output PLA for more than 16 inputs.\n" );
        return 0;
    }    
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WritePla(): Cannot open the output file.\n" );
        return 0;
    }
    fprintf( pFile, "# Benchmark \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );
    Io_WriteMoPlaOne( pFile, pNtk );
    fclose( pFile );
    return 1;
}